

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_view.cpp
# Opt level: O2

void ViewTrack_MFM_FM(Encoding encoding,BitBuffer *bitbuf)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  undefined4 extraout_var;
  reference pvVar4;
  LogHelper *pLVar5;
  int i;
  int iVar6;
  char cVar7;
  uint uVar8;
  Encoding EVar9;
  uint uVar10;
  Encoding EVar11;
  size_type __n;
  uint uVar12;
  colour local_8d;
  int local_8c;
  Encoding local_88;
  uint local_84;
  ulong local_80;
  undefined8 local_78;
  undefined8 local_70;
  vector<colour,_std::allocator<colour>_> colours;
  Encoding encoding_local;
  Data track_data;
  
  local_88 = encoding;
  encoding_local = encoding;
  iVar3 = BitBuffer::track_bitsize(bitbuf);
  track_data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  colours.super__Vector_base<colour,_std::allocator<colour>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  track_data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  track_data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  colours.super__Vector_base<colour,_std::allocator<colour>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  colours.super__Vector_base<colour,_std::allocator<colour>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  __n = (size_type)((iVar3 * 0x6e) / 100);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
            (&track_data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>,__n);
  std::vector<colour,_std::allocator<colour>_>::reserve(&colours,__n);
  iVar3 = opt.a1sync;
  local_70 = 0;
  BitBuffer::seek(bitbuf,0);
  local_80 = 0xffff;
  local_78 = 0;
  local_8c = 0;
  uVar12 = 0;
  EVar9 = local_88;
LAB_0015d279:
  uVar8 = 0;
  EVar11 = EVar9;
  do {
    uVar8 = ~uVar8;
LAB_0015d280:
    uVar10 = uVar8;
    bVar1 = BitBuffer::wrapped(bitbuf);
    if (bVar1) {
      iVar3 = 0;
      if (0 < opt.bytes_begin) {
        iVar3 = opt.bytes_begin;
      }
      uVar8 = (int)track_data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
              (int)track_data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
      uVar12 = uVar8;
      if (opt.bytes_end < (int)uVar8) {
        uVar12 = opt.bytes_end;
      }
      if (opt.bytes_end < 0) {
        uVar12 = uVar8;
      }
      if (iVar3 < (int)uVar12) {
        pLVar5 = util::operator<<((LogHelper *)&util::cout,&encoding_local);
        pLVar5 = util::operator<<(pLVar5,(char (*) [10])" Decode (");
        local_84 = BitBuffer::track_bitsize(bitbuf);
        pLVar5 = util::operator<<(pLVar5,(int *)&local_84);
        util::operator<<(pLVar5,(char (*) [9])" bits):\n");
        util::
        hex_dump<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  ((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )track_data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start,
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )(track_data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start + uVar12),iVar3,
                   colours.super__Vector_base<colour,_std::allocator<colour>_>._M_impl.
                   super__Vector_impl_data._M_start,0x10);
      }
      std::_Vector_base<colour,_std::allocator<colour>_>::~_Vector_base
                (&colours.super__Vector_base<colour,_std::allocator<colour>_>);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&track_data);
      return;
    }
    bVar2 = BitBuffer::read1(bitbuf);
    uVar12 = (uint)bVar2 | uVar12 * 2;
    if (EVar11 != MFM) {
      if ((EVar11 != FM) ||
         ((((0x22 < uVar12 + 0x55ddd778 ||
            ((0x500000005U >> ((ulong)(uVar12 + 0x55ddd778) & 0x3f) & 1) == 0)) &&
           (uVar12 != 0xaa222a8a)) && ((uVar12 != 0xaa222aa8 && (uVar12 != 0xaa2a2a88))))))
      goto LAB_0015d2e1;
      bVar1 = false;
      goto LAB_0015d31a;
    }
    if ((uVar12 & ((uint)(iVar3 == 0) << 5 | 0xffdf)) == 0x4489) {
      bVar1 = false;
      goto LAB_0015d345;
    }
    uVar8 = -uVar10;
    EVar11 = MFM;
  } while (uVar10 != 0xfffffff0);
  bVar1 = true;
LAB_0015d345:
  bVar2 = 0;
  uVar8 = 0xe;
  for (iVar6 = 7; -1 < iVar6; iVar6 = iVar6 + -1) {
    bVar2 = bVar2 | ((uVar12 >> (uVar8 & 0x1f) & 1) != 0) << ((byte)iVar6 & 0x1f);
    uVar8 = uVar8 - 2;
  }
  goto LAB_0015d367;
LAB_0015d2e1:
  uVar8 = uVar10 - 1;
  if (uVar10 - 1 != 0xffffffdf) goto LAB_0015d280;
  bVar1 = true;
  if (EVar11 == MFM) goto LAB_0015d345;
LAB_0015d31a:
  bVar2 = 0;
  uVar8 = 0x1d;
  for (iVar6 = 7; -1 < iVar6; iVar6 = iVar6 + -1) {
    bVar2 = bVar2 | ((uVar12 >> (uVar8 & 0x1f) & 1) != 0) << ((byte)iVar6 & 0x1f);
    uVar8 = uVar8 - 4;
  }
LAB_0015d367:
  local_84 = CONCAT31(local_84._1_3_,bVar2);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            (&track_data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
             (value_type *)&local_84);
  uVar8 = (int)local_80 + 1;
  if (EVar9 == MFM && !bVar1) {
    local_8d = (uVar10 != 0xfffffff0) * -0x80 + YELLOW;
    std::vector<colour,_std::allocator<colour>_>::emplace_back<colour>(&colours,&local_8d);
    local_8c = local_8c + 1;
    EVar9 = MFM;
    local_80 = (ulong)uVar8;
  }
  else {
    if (uVar8 == 4 && (char)local_78 == -2) {
      iVar6 = Sector::SizeCodeToLength(local_84 & 0xff);
      local_70 = CONCAT44(extraout_var,iVar6);
    }
    if (local_8c == 3) {
      local_8d = RED;
      pvVar4 = std::vector<colour,_std::allocator<colour>_>::emplace_back<colour>
                         (&colours,&local_8d);
      local_80 = 0;
      local_78 = CONCAT71((int7)((ulong)pvVar4 >> 8),(undefined1)local_84);
      local_8c = 0;
    }
    else if (bVar1 || local_88 != FM) {
      cVar7 = (char)local_78;
      uVar10 = (uint)local_80;
      if (uVar10 < 4 && cVar7 == -2) {
        local_8d = (uVar8 != 3) * -0x80 + GREEN;
        pvVar4 = std::vector<colour,_std::allocator<colour>_>::emplace_back<colour>
                           (&colours,&local_8d);
        local_78 = CONCAT71((int7)((ulong)pvVar4 >> 8),0xfe);
      }
      else if (((cVar7 == -5) && (-1 < (int)uVar10)) && ((int)uVar10 < (int)local_70)) {
        local_8d = none;
        pvVar4 = std::vector<colour,_std::allocator<colour>_>::emplace_back<colour>
                           (&colours,&local_8d);
        local_78 = CONCAT71((int7)((ulong)pvVar4 >> 8),0xfb);
      }
      else if ((cVar7 == -2 && (uVar10 & 0xfffffffe) == 4) ||
              (((cVar7 == -5 && ((int)local_70 <= (int)uVar10)) && ((int)uVar10 < (int)local_70 + 2)
               ))) {
        local_8d = MAGENTA;
        std::vector<colour,_std::allocator<colour>_>::emplace_back<colour>(&colours,&local_8d);
      }
      else {
        local_8d = cyan;
        std::vector<colour,_std::allocator<colour>_>::emplace_back<colour>(&colours,&local_8d);
      }
      local_8c = 0;
      local_80 = (ulong)uVar8;
      EVar9 = local_88;
    }
    else {
      local_8d = (uVar10 != 0xffffffe0) * -0x80 + RED;
      pvVar4 = std::vector<colour,_std::allocator<colour>_>::emplace_back<colour>
                         (&colours,&local_8d);
      local_80 = 0;
      local_78 = CONCAT71((int7)((ulong)pvVar4 >> 8),(undefined1)local_84);
      EVar9 = FM;
      local_8c = 0;
    }
  }
  goto LAB_0015d279;
}

Assistant:

void ViewTrack_MFM_FM(Encoding encoding, BitBuffer& bitbuf)
{
    auto max_size = bitbuf.track_bitsize() * 110 / 100;

    Data track_data;
    std::vector<colour> colours;
    track_data.reserve(max_size);
    colours.reserve(max_size);

    uint32_t dword = 0;
    int bits = 0, a1 = 0, am_dist = 0xffff, data_size = 0;
    uint8_t am = 0;
    uint16_t sync_mask = opt.a1sync ? 0xffdf : 0xffff;

    bitbuf.seek(0);
    while (!bitbuf.wrapped())
    {
        dword = (dword << 1) | bitbuf.read1();
        ++bits;

        bool found_am = false;
        if (encoding == Encoding::MFM && (dword & sync_mask) == 0x4489)
        {
            found_am = true;
        }
        else if (encoding == Encoding::FM)
        {
            switch (dword)
            {
            case 0xaa222888:    // F8/C7 DDAM
            case 0xaa22288a:    // F9/C7 Alt-DDAM
            case 0xaa2228a8:    // FA/C7 Alt-DAM
            case 0xaa2228aa:    // FB/C7 DAM
            case 0xaa2a2a88:    // FC/D7 IAM
            case 0xaa222a8a:    // FD/C7 RX02 DAM
            case 0xaa222aa8:    // FE/C7 IDAM
                found_am = true;
                break;
            }
        }

        if (found_am || (bits == (encoding == Encoding::MFM ? 16 : 32)))
        {
            // Decode data byte.
            uint8_t b = 0;
            if (encoding == Encoding::MFM)
            {
                for (int i = 7; i >= 0; --i)
                    b |= static_cast<uint8_t>(((dword >> (i * 2)) & 1) << i);
            }
            else
            {
                for (int i = 7; i >= 0; --i)
                    b |= static_cast<uint8_t>(((dword >> (i * 4 + 1)) & 1) << i);
            }
            track_data.push_back(b);
            ++am_dist;

            if (encoding == Encoding::MFM && found_am)
            {
                // A1 sync byte (red if aligned to bitstream, magenta if not).
                colours.push_back((bits == 16) ? colour::YELLOW : colour::yellow);
                ++a1;
            }
            else
            {
                if (am == 0xfe && am_dist == 4)
                    data_size = Sector::SizeCodeToLength(b);

                if (a1 == 3)
                {
                    colours.push_back(colour::RED);
                    am = b;
                    am_dist = 0;
                }
                else if (encoding == Encoding::FM && found_am)
                {
                    colours.push_back((bits == 32) ? colour::RED : colour::red);
                    am = b;
                    am_dist = 0;
                }
                else if (am == 0xfe && am_dist >= 1 && am_dist <= 4)
                {
                    colours.push_back((am_dist == 3) ? colour::GREEN : colour::green);
                }
                else if (am == 0xfb && am_dist >= 1 && am_dist <= data_size)
                {
                    colours.push_back(colour::white);
                }
                else if ((am == 0xfe && am_dist > 4 && am_dist <= 6) ||
                    (am == 0xfb && am_dist > data_size&& am_dist <= (data_size + 2)))
                {
                    colours.push_back(colour::MAGENTA);
                }
                else
                {
                    colours.push_back(colour::grey);
                }

                a1 = 0;
            }

            bits = 0;
        }
    }

    auto show_begin = std::max(opt.bytes_begin, 0);
    auto show_end = (opt.bytes_end < 0) ? track_data.size() :
        std::min(opt.bytes_end, track_data.size());
    if (show_end > show_begin)
    {
        util::cout << encoding << " Decode (" << bitbuf.track_bitsize() << " bits):\n";
        util::hex_dump(track_data.begin(), track_data.begin() + show_end,
            show_begin, colours.data());
    }
}